

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O1

object_t<2UL,_char> *
make<2ul,char>(object_t<2UL,_char> *__return_storage_ptr__,size_t N,char *value)

{
  allocator_type local_31;
  vector<char,_std::allocator<char>_> local_30;
  
  std::vector<char,_std::allocator<char>_>::vector(&local_30,N,value,&local_31);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,N,&local_30,(allocator_type *)&local_31);
  if (local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make(size_t N, const T& value) {
  if constexpr (Dim > 1) {
    return object_t<Dim, T>(N, make<Dim-1, T>(N, value));
  } else {
    return object_t<Dim, T>(N, value);
  }
}